

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O2

void __thiscall FatSystem::~FatSystem(FatSystem *this)

{
  close(this->fd);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->cache)._M_t);
  std::__cxx11::string::~string((string *)&this->fsType);
  std::__cxx11::string::~string((string *)&this->oemName);
  std::__cxx11::string::~string((string *)&this->diskLabel);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FatSystem::~FatSystem()
{
    close(fd);
}